

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O2

void __thiscall
cs::compiler_type::import_csym(compiler_type *this,string *module_path,string *csym_path)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  unsigned_long_long uVar4;
  size_type sVar5;
  string buff;
  pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::csym_info>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::csym_info>_>_>::iterator,_bool>
  local_320;
  string map_str;
  string header;
  smatch match;
  regex reg;
  csym_info csym;
  ifstream ifs;
  byte abStack_218 [488];
  
  std::ifstream::ifstream(&ifs,(string *)csym_path,_S_in);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    csym.file._M_dataplus._M_p = (pointer)&csym.file.field_2;
    csym.file._M_string_length = 0;
    csym.file.field_2._M_local_buf[0] = '\0';
    csym.map.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    csym.map.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    csym.map.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    csym.codes.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    csym.codes.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    csym.codes.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&reg,"^#\\$cSYM/1\\.0\\(([^\\)]*)\\):(.*)$",0x10);
    header._M_dataplus._M_p = (pointer)&header.field_2;
    header._M_string_length = 0;
    header.field_2._M_local_buf[0] = '\0';
    buff._M_dataplus._M_p = (pointer)&buff.field_2;
    buff._M_string_length = 0;
    buff.field_2._M_local_buf[0] = '\0';
    iVar3 = std::istream::get();
    bVar2 = false;
    while ((abStack_218[*(long *)(_ifs + -0x18)] & 5) == 0) {
      cVar1 = (char)&buff;
      if (bVar2) {
        if (iVar3 != 10) {
          std::__cxx11::string::push_back(cVar1);
          goto LAB_0012944d;
        }
LAB_00129459:
        if (header._M_string_length == 0) {
          std::__cxx11::string::swap((string *)&header);
        }
        else {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string&>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &csym.codes,&buff);
          buff._M_string_length = 0;
          *buff._M_dataplus._M_p = '\0';
        }
LAB_0012949b:
        bVar2 = false;
      }
      else {
LAB_0012944d:
        if (iVar3 != 0xd) {
          if (iVar3 == 10) goto LAB_00129459;
          std::__cxx11::string::push_back(cVar1);
          goto LAB_0012949b;
        }
        bVar2 = true;
      }
      iVar3 = std::istream::get();
    }
    if (buff._M_string_length != 0) {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&csym.codes,
                 &buff);
    }
    match.
    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    .
    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    match._M_begin._M_current = (char *)0x0;
    match.
    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    .
    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    match.
    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    .
    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    bVar2 = std::
            regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                      (&header,&match,&reg,0);
    if (bVar2) {
      std::__cxx11::
      match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::str(&map_str,&match,1);
      std::__cxx11::string::operator=((string *)&csym,(string *)&map_str);
      std::__cxx11::string::~string((string *)&map_str);
      std::__cxx11::
      match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::str(&map_str,&match,2);
      for (sVar5 = 0; map_str._M_string_length != sVar5; sVar5 = sVar5 + 1) {
        if (map_str._M_dataplus._M_p[sVar5] == ',') {
          if (buff._M_string_length != 0) {
            bVar2 = std::operator!=(&buff,"-");
            if (bVar2) {
              uVar4 = std::__cxx11::stoull(&buff,(size_t *)0x0,10);
              local_320.first.ctrl_ = (ctrl_t *)(uVar4 + 1);
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
              emplace_back<unsigned_long>(&csym.map,(unsigned_long *)&local_320);
            }
            else {
              local_320.first.ctrl_ = (ctrl_t *)0x0;
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
              emplace_back<unsigned_long>(&csym.map,(unsigned_long *)&local_320);
            }
            buff._M_string_length = 0;
            *buff._M_dataplus._M_p = '\0';
          }
        }
        else {
          std::__cxx11::string::push_back((char)&buff);
        }
      }
      if (buff._M_string_length != 0) {
        bVar2 = std::operator!=(&buff,"-");
        if (bVar2) {
          uVar4 = std::__cxx11::stoull(&buff,(size_t *)0x0,10);
          local_320.first.ctrl_ = (ctrl_t *)(uVar4 + 1);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                    (&csym.map,(unsigned_long *)&local_320);
        }
        else {
          local_320.first.ctrl_ = (ctrl_t *)0x0;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                    (&csym.map,(unsigned_long *)&local_320);
        }
        buff._M_string_length = 0;
        *buff._M_dataplus._M_p = '\0';
      }
      phmap::priv::
      raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::csym_info>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::csym_info>_>_>
      ::
      emplace<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cs::csym_info,_0>
                (&local_320,
                 (raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::csym_info>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::csym_info>_>_>
                  *)&this->csyms,module_path,&csym);
      std::__cxx11::string::~string((string *)&map_str);
    }
    std::
    _Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::~_Vector_base((_Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     *)&match);
    std::__cxx11::string::~string((string *)&buff);
    std::__cxx11::string::~string((string *)&header);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&reg);
    csym_info::~csym_info(&csym);
  }
  std::ifstream::~ifstream(&ifs);
  return;
}

Assistant:

void compiler_type::import_csym(const std::string &module_path, const std::string &csym_path)
	{
		std::ifstream ifs(csym_path);
		if (!ifs.is_open())
			return;
		csym_info csym;
		std::regex reg("^#\\$cSYM/1\\.0\\(([^\\)]*)\\):(.*)$");
		// Read file
		std::string header, buff;
		bool expect_n = false;
		for (int ch = ifs.get(); ifs; ch = ifs.get()) {
			if (expect_n) {
				expect_n = false;
				if (ch != '\n')
					buff += '\r';
			}
			switch (ch) {
			case '\n':
				if (!header.empty()) {
					csym.codes.emplace_back(buff);
					buff.clear();
				}
				else
					std::swap(header, buff);
				break;
			case '\r':
				expect_n = true;
				break;
			default:
				buff += ch;
				break;
			}
		}
		if (!buff.empty()) {
			csym.codes.emplace_back(buff);
		}
		// Parsing header
		std::smatch match;
		if (!std::regex_match(header, match, reg))
			return;
		csym.file = match.str(1);
		std::string map_str = match.str(2);
		for (auto &ch: map_str) {
			if (ch == ',') {
				if (!buff.empty()) {
					if (buff != "-")
						csym.map.push_back(std::stoull(buff) + 1);
					else
						csym.map.push_back(0);
					buff.clear();
				}
			}
			else
				buff += ch;
		}
		if (!buff.empty()) {
			if (buff != "-")
				csym.map.push_back(std::stoull(buff) + 1);
			else
				csym.map.push_back(0);
			buff.clear();
		}
		csyms.emplace(module_path, std::move(csym));
	}